

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O3

void __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::iterator
          (iterator *this,
          db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *tree)

{
  deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  
  this->db_ = tree;
  auVar3 = ZEXT1632(ZEXT816(0) << 0x40);
  pdVar1 = &(this->stack_).c;
  (pdVar1->
  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  )._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)auVar3._0_8_;
  (pdVar1->
  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  )._M_impl.super__Deque_impl_data._M_map_size = auVar3._8_8_;
  (pdVar1->
  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)auVar3._16_8_;
  (pdVar1->
  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  )._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)auVar3._24_8_;
  *(undefined1 (*) [32])
   &(this->stack_).c.
    super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = auVar3;
  (this->stack_).c.
  super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ._M_impl.super__Deque_impl_data._M_finish = (iterator)ZEXT1632(ZEXT816(0) << 0x40);
  std::
  _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
  ::_M_initialize_map((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                       *)&this->stack_,0);
  auVar2 = ZEXT816(0) << 0x40;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0xe0) = ZEXT1632(auVar2);
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0xc0) = ZEXT1632(auVar2);
  auVar3 = ZEXT1632(auVar2);
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0xa0) = auVar3;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0x80) = auVar3;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0x60) = auVar3;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0x40) = auVar3;
  *(undefined1 (*) [32])((this->keybuf_).ibuf + 0x20) = ZEXT1632(auVar2);
  *(undefined1 (*) [32])(this->keybuf_).ibuf = ZEXT1632(auVar2);
  (this->keybuf_).buf = (this->keybuf_).ibuf;
  (this->keybuf_).cap = 0x100;
  (this->keybuf_).off = 0;
  return;
}

Assistant:

explicit iterator(db& tree) noexcept : db_(tree) {}